

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O2

edata_t * extent_recycle(tsdn_t *tsdn,pac_t *pac,ehooks_t *ehooks,ecache_t *ecache,
                        edata_t *expand_edata,size_t size,size_t alignment,_Bool zero,_Bool *commit,
                        _Bool growing_retained,_Bool guarded)

{
  _Bool _Var1;
  extent_split_interior_result_t eVar2;
  edata_t *peVar3;
  eset_t *eset;
  uint lg_max_fit;
  undefined1 growing_retained_00;
  edata_t **trail_00;
  size_t in_stack_ffffffffffffff88;
  edata_t *local_58;
  edata_t *to_leak;
  edata_t *trail;
  edata_t *lead;
  edata_t *local_38;
  
  malloc_mutex_lock(tsdn,&ecache->mtx);
  eset = &ecache->eset;
  if (guarded) {
    eset = &ecache->guarded_eset;
  }
  if (expand_edata == (edata_t *)0x0) {
    lg_max_fit = (uint)duckdb_je_opt_lg_extent_max_active_fit;
    if (ecache->delay_coalesce == false) {
      lg_max_fit = 0x40;
    }
    peVar3 = duckdb_je_eset_fit(eset,size,alignment,guarded,lg_max_fit);
    if (peVar3 != (edata_t *)0x0) {
LAB_01e8ce00:
      duckdb_je_eset_remove(eset,peVar3);
      duckdb_je_emap_update_edata_state(tsdn,pac->emap,peVar3,extent_state_active);
      to_leak = (edata_t *)0x0;
      local_58 = (edata_t *)0x0;
      trail_00 = &trail;
      local_38 = peVar3;
      eVar2 = extent_split_interior
                        (tsdn,pac,ehooks,&local_38,&lead,trail_00,&to_leak,&local_58,(edata_t *)size
                         ,alignment,in_stack_ffffffffffffff88);
      growing_retained_00 = SUB81(trail_00,0);
      if (eVar2 == extent_split_interior_ok) {
        if (lead != (edata_t *)0x0) {
          extent_deactivate_locked_impl(tsdn,pac,ecache,lead);
        }
        peVar3 = local_38;
        if (trail != (edata_t *)0x0) {
          extent_deactivate_locked_impl(tsdn,pac,ecache,trail);
          peVar3 = local_38;
        }
      }
      else {
        if (local_58 != (edata_t *)0x0) {
          extent_deregister(tsdn,pac,local_58);
        }
        peVar3 = to_leak;
        if (to_leak != (edata_t *)0x0) {
          extent_deregister_no_gdump_sub(tsdn,pac,to_leak);
          (ecache->mtx).field_0.field_0.locked.repr = false;
          pthread_mutex_unlock((pthread_mutex_t *)((long)&(ecache->mtx).field_0 + 0x48));
          extents_abandon_vm(tsdn,pac,ehooks,ecache,peVar3,(_Bool)growing_retained_00);
          malloc_mutex_lock(tsdn,&ecache->mtx);
        }
        peVar3 = (edata_t *)0x0;
      }
      (ecache->mtx).field_0.field_0.locked.repr = false;
      pthread_mutex_unlock((pthread_mutex_t *)((long)&(ecache->mtx).field_0 + 0x48));
      if (peVar3 == (edata_t *)0x0) {
        return (edata_t *)0x0;
      }
      _Var1 = duckdb_je_extent_commit_zero(tsdn,ehooks,peVar3,*commit,zero,false);
      if (_Var1) {
        duckdb_je_extent_record(tsdn,pac,ehooks,ecache,peVar3);
        return (edata_t *)0x0;
      }
      if ((peVar3->e_bits & 0x2000) != 0) {
        *commit = true;
        return peVar3;
      }
      return peVar3;
    }
  }
  else {
    peVar3 = duckdb_je_emap_try_acquire_edata_neighbor_expand
                       (tsdn,pac->emap,expand_edata,EXTENT_PAI_PAC,ecache->state);
    if (peVar3 != (edata_t *)0x0) {
      if (size <= ((peVar3->field_2).e_size_esn & 0xfffffffffffff000)) goto LAB_01e8ce00;
      duckdb_je_emap_release_edata(tsdn,pac->emap,peVar3,ecache->state);
    }
  }
  (ecache->mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&(ecache->mtx).field_0 + 0x48));
  return (edata_t *)0x0;
}

Assistant:

static edata_t *
extent_recycle(tsdn_t *tsdn, pac_t *pac, ehooks_t *ehooks, ecache_t *ecache,
    edata_t *expand_edata, size_t size, size_t alignment, bool zero,
    bool *commit, bool growing_retained, bool guarded) {
	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, growing_retained ? 1 : 0);
	assert(!guarded || expand_edata == NULL);
	assert(!guarded || alignment <= PAGE);

	malloc_mutex_lock(tsdn, &ecache->mtx);

	edata_t *edata = extent_recycle_extract(tsdn, pac, ehooks, ecache,
	    expand_edata, size, alignment, guarded);
	if (edata == NULL) {
		malloc_mutex_unlock(tsdn, &ecache->mtx);
		return NULL;
	}

	edata = extent_recycle_split(tsdn, pac, ehooks, ecache, expand_edata,
	    size, alignment, edata, growing_retained);
	malloc_mutex_unlock(tsdn, &ecache->mtx);
	if (edata == NULL) {
		return NULL;
	}

	assert(edata_state_get(edata) == extent_state_active);
	if (extent_commit_zero(tsdn, ehooks, edata, *commit, zero,
	    growing_retained)) {
		extent_record(tsdn, pac, ehooks, ecache, edata);
		return NULL;
	}
	if (edata_committed_get(edata)) {
		/*
		 * This reverses the purpose of this variable - previously it
		 * was treated as an input parameter, now it turns into an
		 * output parameter, reporting if the edata has actually been
		 * committed.
		 */
		*commit = true;
	}
	return edata;
}